

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O1

bool __thiscall
phmap::priv::
raw_hash_set<phmap::priv::FlatHashSetPolicy<phmap::priv::hash_internal::EnumClass>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::EnumClass>_>
::find_impl<phmap::priv::hash_internal::EnumClass>
          (raw_hash_set<phmap::priv::FlatHashSetPolicy<phmap::priv::hash_internal::EnumClass>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::EnumClass>_>
           *this,key_arg<phmap::priv::hash_internal::EnumClass> *key,size_t hashval,size_t *offset)

{
  char *pcVar1;
  ctrl_t *pcVar2;
  ulong uVar3;
  slot_type *psVar4;
  key_arg<phmap::priv::hash_internal::EnumClass> kVar5;
  uint uVar6;
  ushort uVar7;
  char cVar8;
  char cVar9;
  char cVar10;
  char cVar11;
  char cVar12;
  char cVar13;
  char cVar14;
  char cVar15;
  char cVar16;
  char cVar17;
  char cVar18;
  char cVar19;
  char cVar20;
  char cVar21;
  char cVar22;
  char cVar23;
  byte bVar24;
  ulong uVar26;
  uint uVar27;
  long lVar28;
  ulong uVar29;
  long lVar30;
  bool bVar31;
  __m128i match;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar35 [16];
  byte bVar25;
  char cVar34;
  char cVar36;
  char cVar37;
  char cVar38;
  
  pcVar2 = this->ctrl_;
  if (pcVar2 == (ctrl_t *)0x0) {
    bVar24 = 0;
  }
  else {
    uVar3 = this->capacity_;
    if ((uVar3 + 1 & uVar3) != 0) {
      __assert_fail("((mask + 1) & mask) == 0 && \"not a mask\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap.h"
                    ,0x95,"phmap::priv::probe_seq<16>::probe_seq(size_t, size_t) [Width = 16]");
    }
    uVar29 = hashval >> 7 & uVar3;
    bVar25 = (byte)hashval;
    bVar24 = bVar25 & 0x7f;
    auVar32 = ZEXT216(CONCAT11(bVar25,bVar25) & 0x7f7f);
    auVar32 = pshuflw(auVar32,auVar32,0);
    psVar4 = this->slots_;
    kVar5 = *key;
    lVar28 = 0;
    do {
      pcVar1 = pcVar2 + uVar29;
      cVar8 = *pcVar1;
      cVar9 = pcVar1[1];
      cVar10 = pcVar1[2];
      cVar11 = pcVar1[3];
      cVar12 = pcVar1[4];
      cVar13 = pcVar1[5];
      cVar14 = pcVar1[6];
      cVar15 = pcVar1[7];
      cVar16 = pcVar1[8];
      cVar17 = pcVar1[9];
      cVar18 = pcVar1[10];
      cVar19 = pcVar1[0xb];
      cVar20 = pcVar1[0xc];
      cVar21 = pcVar1[0xd];
      cVar22 = pcVar1[0xe];
      cVar23 = pcVar1[0xf];
      cVar34 = auVar32[0];
      auVar35[0] = -(cVar34 == cVar8);
      cVar36 = auVar32[1];
      auVar35[1] = -(cVar36 == cVar9);
      cVar37 = auVar32[2];
      auVar35[2] = -(cVar37 == cVar10);
      cVar38 = auVar32[3];
      auVar35[3] = -(cVar38 == cVar11);
      auVar35[4] = -(cVar34 == cVar12);
      auVar35[5] = -(cVar36 == cVar13);
      auVar35[6] = -(cVar37 == cVar14);
      auVar35[7] = -(cVar38 == cVar15);
      auVar35[8] = -(cVar34 == cVar16);
      auVar35[9] = -(cVar36 == cVar17);
      auVar35[10] = -(cVar37 == cVar18);
      auVar35[0xb] = -(cVar38 == cVar19);
      auVar35[0xc] = -(cVar34 == cVar20);
      auVar35[0xd] = -(cVar36 == cVar21);
      auVar35[0xe] = -(cVar37 == cVar22);
      auVar35[0xf] = -(cVar38 == cVar23);
      uVar7 = (ushort)(SUB161(auVar35 >> 7,0) & 1) | (ushort)(SUB161(auVar35 >> 0xf,0) & 1) << 1 |
              (ushort)(SUB161(auVar35 >> 0x17,0) & 1) << 2 |
              (ushort)(SUB161(auVar35 >> 0x1f,0) & 1) << 3 |
              (ushort)(SUB161(auVar35 >> 0x27,0) & 1) << 4 |
              (ushort)(SUB161(auVar35 >> 0x2f,0) & 1) << 5 |
              (ushort)(SUB161(auVar35 >> 0x37,0) & 1) << 6 |
              (ushort)(SUB161(auVar35 >> 0x3f,0) & 1) << 7 |
              (ushort)(SUB161(auVar35 >> 0x47,0) & 1) << 8 |
              (ushort)(SUB161(auVar35 >> 0x4f,0) & 1) << 9 |
              (ushort)(SUB161(auVar35 >> 0x57,0) & 1) << 10 |
              (ushort)(SUB161(auVar35 >> 0x5f,0) & 1) << 0xb |
              (ushort)(SUB161(auVar35 >> 0x67,0) & 1) << 0xc |
              (ushort)(SUB161(auVar35 >> 0x6f,0) & 1) << 0xd |
              (ushort)(SUB161(auVar35 >> 0x77,0) & 1) << 0xe | (ushort)(auVar35[0xf] >> 7) << 0xf;
      bVar31 = uVar7 == 0;
      if (!bVar31) {
        uVar27 = (uint)uVar7;
        do {
          uVar6 = 0;
          if (uVar27 != 0) {
            for (; (uVar27 >> uVar6 & 1) == 0; uVar6 = uVar6 + 1) {
            }
          }
          uVar26 = uVar6 + uVar29 & uVar3;
          bVar24 = bVar24 | psVar4[uVar26] == kVar5;
          if (psVar4[uVar26] == kVar5) break;
          uVar27 = uVar27 - 1 & uVar27;
          bVar31 = uVar27 == 0;
        } while (!bVar31);
        *offset = uVar26;
      }
      if (bVar31) {
        auVar33[0] = -(cVar8 == -0x80);
        auVar33[1] = -(cVar9 == -0x80);
        auVar33[2] = -(cVar10 == -0x80);
        auVar33[3] = -(cVar11 == -0x80);
        auVar33[4] = -(cVar12 == -0x80);
        auVar33[5] = -(cVar13 == -0x80);
        auVar33[6] = -(cVar14 == -0x80);
        auVar33[7] = -(cVar15 == -0x80);
        auVar33[8] = -(cVar16 == -0x80);
        auVar33[9] = -(cVar17 == -0x80);
        auVar33[10] = -(cVar18 == -0x80);
        auVar33[0xb] = -(cVar19 == -0x80);
        auVar33[0xc] = -(cVar20 == -0x80);
        auVar33[0xd] = -(cVar21 == -0x80);
        auVar33[0xe] = -(cVar22 == -0x80);
        auVar33[0xf] = -(cVar23 == -0x80);
        if ((((((((((((((((auVar33 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                         (auVar33 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        (auVar33 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                       (auVar33 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      (auVar33 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                     (auVar33 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (auVar33 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                   (auVar33 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar33 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                 (auVar33 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (auVar33 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
               (auVar33 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar33 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
             (auVar33 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (auVar33 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar33[0xf]
           ) {
          lVar30 = uVar29 + lVar28;
          lVar28 = lVar28 + 0x10;
          uVar29 = lVar30 + 0x10U & uVar3;
          bVar31 = true;
        }
        else {
          bVar31 = false;
          bVar24 = 0;
        }
      }
      else {
        bVar31 = false;
      }
    } while (bVar31);
  }
  return (bool)(bVar24 & 1);
}

Assistant:

bool find_impl(const key_arg<K>& PHMAP_RESTRICT key, size_t hashval, size_t& PHMAP_RESTRICT offset) {
        PHMAP_IF_CONSTEXPR (!std_alloc_t::value) {
            // ctrl_ could be nullptr
            if (!ctrl_)
                return false;
        }
        auto seq = probe(hashval);
        while (true) {
            Group g{ ctrl_ + seq.offset() };
            for (uint32_t i : g.Match((h2_t)H2(hashval))) {
                offset = seq.offset((size_t)i);
                if (PHMAP_PREDICT_TRUE(PolicyTraits::apply(
                    EqualElement<K>{key, eq_ref()},
                    PolicyTraits::element(slots_ + offset))))
                    return true;
            }
            if (PHMAP_PREDICT_TRUE(g.MatchEmpty()))
                return false;
            seq.next();
        }
    }